

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O1

void __thiscall ByteCodeGenerator::StartEmitFunction(ByteCodeGenerator *this,ParseNodeFnc *pnodeFnc)

{
  byte *pbVar1;
  undefined1 *puVar2;
  Scope *pSVar3;
  IdentPtr pIVar4;
  long lVar5;
  char16_t *pcVar6;
  ParseNodeBlock *pPVar7;
  code *pcVar8;
  anon_class_24_3_c793ac44 handler;
  anon_class_24_3_c793ac44 handler_00;
  bool bVar9;
  ushort uVar10;
  uint uVar11;
  LocalFunctionId functionId;
  RegSlot RVar12;
  undefined4 *puVar13;
  FunctionBody *pFVar14;
  ByteBlock *pBVar15;
  Symbol *pSVar16;
  ParseNodeVar *pPVar17;
  ScriptContext *pSVar18;
  ParseNodePtr pPVar19;
  ParseNode *pPVar20;
  ParseNodeParamPattern *pPVar21;
  uint uVar22;
  Symbol *pSVar24;
  Scope *innerScope;
  anon_class_16_2_85211fcd handler_01;
  anon_class_16_2_85211fcd handler_02;
  anon_class_16_2_85211fcd handler_03;
  anon_class_16_2_85211fcd handler_04;
  anon_class_24_3_8900e8ef local_68;
  Scope *local_50;
  Scope *local_48;
  Symbol *local_40;
  Symbol *sym;
  FuncInfo *funcInfo;
  uint uVar23;
  
  if (((pnodeFnc->super_ParseNode).nop | knopInt) != knopProg) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar13 = 1;
    bVar9 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                       ,0xdb5,"(pnodeFnc->nop == knopFncDecl || pnodeFnc->nop == knopProg)",
                       "pnodeFnc->nop == knopFncDecl || pnodeFnc->nop == knopProg");
    if (!bVar9) goto LAB_00816423;
    *puVar13 = 0;
  }
  sym = (Symbol *)pnodeFnc->funcInfo;
  local_50 = ((FuncInfo *)sym)->paramScope;
  innerScope = ((FuncInfo *)sym)->bodyScope;
  bVar9 = Js::ParseableFunctionInfo::IsFunctionParsed(((FuncInfo *)sym)->byteCodeFunction);
  if ((bVar9) && (*(long *)(*(long *)&sym[6].name.len + 0x58) != 0)) {
    pFVar14 = FuncInfo::GetParsedFunctionBody((FuncInfo *)sym);
    pBVar15 = Js::FunctionBody::GetByteCode(pFVar14);
    if ((pBVar15 == (ByteBlock *)0x0) && ((this->flags & 0x404) == 0)) {
      pFVar14 = FuncInfo::GetParsedFunctionBody((FuncInfo *)sym);
      pFVar14->m_envDepth = this->envDepth;
    }
    if (((ulong)sym[2].pid & 0x200000000) != 0) {
      pbVar1 = (byte *)((long)&sym[6].pid[1].m_propertyId + 3);
      *pbVar1 = *pbVar1 | 8;
    }
    pSVar3 = (Scope *)sym[6].name.string.ptr;
    local_48 = innerScope;
    if (pSVar3 != (Scope *)0x0) {
      if ((((ulong)sym[2].pid & 0x200000000) != 0) && ((pSVar3->field_0x44 & 2) == 0)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar13 = 1;
        bVar9 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                           ,0xdcd,"(funcExprScope->GetIsObject())","funcExprScope->GetIsObject()");
        if (!bVar9) goto LAB_00816423;
        *puVar13 = 0;
      }
      if ((*(ushort *)&pSVar3->field_0x44 & 2) == 0) {
        pSVar16 = ParseNodeFnc::GetFuncSymbol(*(ParseNodeFnc **)&sym[6].name.len);
        Scope::AddSymbol(*(Scope **)
                          (&sym[5].symbolType +
                          (ulong)(*(ushort *)((long)&sym[2].pid + 4) >> 0xf) * 8),pSVar16);
        Symbol::EnsureScopeSlot(pSVar16,this,(FuncInfo *)sym);
        if ((pSVar16->field_0x42 & 0x10) != 0) {
          puVar2 = &pSVar16->scope->field_0x44;
          *(ushort *)puVar2 = *(ushort *)puVar2 | 0x100;
        }
      }
      else {
        *(ushort *)&pSVar3->field_0x44 = *(ushort *)&pSVar3->field_0x44 | 0x18;
        PushScope(this,pSVar3);
      }
    }
    innerScope = local_48;
    if ((pnodeFnc->super_ParseNode).nop == knopProg) {
      if ((((sym[6].pid[1].m_propertyId & 0x10000) != 0) && ((this->flags & 0x400) != 0)) &&
         ((local_48->field_0x44 & 2) == 0)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar13 = 1;
        bVar9 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                           ,0xef6,"(bodyScope->GetIsObject())","bodyScope->GetIsObject()");
        if (!bVar9) goto LAB_00816423;
        *puVar13 = 0;
      }
    }
    else {
      if ((((local_48->field_0x44 & 2) == 0) &&
          (bVar9 = NeedObjectAsFunctionScope(this,(FuncInfo *)sym,pnodeFnc), bVar9)) &&
         ((innerScope->field_0x44 & 2) == 0)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar13 = 1;
        bVar9 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                           ,0xded,"(bodyScope->GetIsObject())","bodyScope->GetIsObject()");
        if (!bVar9) goto LAB_00816423;
        *puVar13 = 0;
      }
      pSVar16 = sym;
      innerScope->location =
           *(RegSlot *)
            ((long)&sym[1].next + (ulong)((*(ushort *)&innerScope->field_0x44 & 2) == 0) * 4);
      if (((ulong)sym[2].pid & 0x800000000000) == 0) {
        local_50->location =
             *(RegSlot *)
              ((long)&sym[1].next + (ulong)((*(ushort *)&local_50->field_0x44 & 2) == 0) * 4);
      }
      if ((local_48->field_0x44 & 2) == 0) {
        EnsureFncScopeSlots(this,pnodeFnc->pnodeScopes->pnodeScopes,(FuncInfo *)sym);
        if (pnodeFnc->pnodeBodyScope != (ParseNodeBlock *)0x0) {
          EnsureFncScopeSlots(this,pnodeFnc->pnodeBodyScope->pnodeScopes,(FuncInfo *)sym);
        }
        pPVar19 = pnodeFnc->pnodeVars;
        while (pPVar19 != (ParseNode *)0x0) {
          pPVar17 = ParseNode::AsParseNodeVar(pPVar19);
          local_40 = pPVar17->sym;
          pPVar17 = ParseNode::AsParseNodeVar(pPVar19);
          pSVar16 = local_40;
          if ((pPVar17->isBlockScopeFncDeclVar == '\0') || ((local_40->field_0x42 & 2) == 0)) {
            if (((*(ushort *)&local_40->field_0x42 & 0x40) != 0) ||
               ((pSVar24 = local_40, (*(ushort *)&local_40->field_0x42 & 2) != 0 &&
                (pPVar19->nop == knopVarDecl)))) {
              pSVar24 = *(Symbol **)(*(long *)&sym[5].assignmentState + 0x20);
              while ((pSVar24 != (Symbol *)0x0 &&
                     (bVar9 = JsUtil::CharacterBuffer<char16_t>::operator==
                                        (&pSVar24->name,&pSVar16->name), !bVar9))) {
                pSVar24 = pSVar24->next;
              }
            }
            local_40 = pSVar24;
            if (((local_40->symbolType == STVariable) &&
                (bVar9 = Symbol::NeedsSlotAlloc(local_40,this,(FuncInfo *)sym), bVar9)) &&
               (bVar9 = Symbol::IsArguments(local_40), !bVar9)) {
              Symbol::EnsureScopeSlot(local_40,this,(FuncInfo *)sym);
            }
          }
          pPVar17 = ParseNode::AsParseNodeVar(pPVar19);
          pPVar19 = pPVar17->pnodeNext;
        }
        for (pPVar20 = pnodeFnc->pnodeParams; pPVar20 != (ParseNode *)0x0;
            pPVar20 = ParseNode::GetFormalNext(pPVar20)) {
          if ((byte)(pPVar20->nop + ~knopList) < 3) {
            pPVar17 = ParseNode::AsParseNodeVar(pPVar20);
            local_40 = pPVar17->sym;
            if ((local_40->symbolType == STFormal) &&
               (bVar9 = Symbol::NeedsSlotAlloc(local_40,this,(FuncInfo *)sym), bVar9)) {
              Symbol::EnsureScopeSlot(local_40,this,(FuncInfo *)sym);
            }
          }
        }
        pPVar20 = pnodeFnc->pnodeRest;
        if ((pPVar20 != (ParseNode *)0x0) && ((byte)(pPVar20->nop + ~knopList) < 3)) {
          pPVar17 = ParseNode::AsParseNodeVar(pPVar20);
          local_40 = pPVar17->sym;
          if ((local_40->symbolType == STFormal) &&
             (bVar9 = Symbol::NeedsSlotAlloc(local_40,this,(FuncInfo *)sym), bVar9)) {
            Symbol::EnsureScopeSlot(local_40,this,(FuncInfo *)sym);
          }
        }
        innerScope = local_48;
        local_68.pnode = (ParseNode **)&local_40;
        local_68.funcInfo = (FuncInfo **)&sym;
        local_68.this = this;
        for (pPVar20 = pnodeFnc->pnodeParams; pPVar20 != (ParseNode *)0x0;
            pPVar20 = ParseNode::GetFormalNext(pPVar20)) {
          if (pPVar20->nop == knopParamPattern) {
            pPVar21 = ParseNode::AsParseNodeParamPattern(pPVar20);
            handler.this = local_68.this;
            handler.sym = (Symbol **)local_68.pnode;
            handler.funcInfo = local_68.funcInfo;
            Parser::MapBindIdentifier<ByteCodeGenerator::StartEmitFunction(ParseNodeFnc*)::__6>
                      ((pPVar21->super_ParseNodeUni).pnode1,handler);
          }
        }
        pPVar20 = pnodeFnc->pnodeRest;
        if ((pPVar20 != (ParseNode *)0x0) && (pPVar20->nop == knopParamPattern)) {
          pPVar21 = ParseNode::AsParseNodeParamPattern(pPVar20);
          handler_00.this = local_68.this;
          handler_00.sym = (Symbol **)local_68.pnode;
          handler_00.funcInfo = local_68.funcInfo;
          Parser::MapBindIdentifier<ByteCodeGenerator::StartEmitFunction(ParseNodeFnc*)::__6>
                    ((pPVar21->super_ParseNodeUni).pnode1,handler_00);
        }
        if (((ulong)sym[2].pid & 0x800000000) != 0) {
          local_40 = (Symbol *)sym[8].scope;
          if (local_40 == (Symbol *)0x0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
            *puVar13 = 1;
            bVar9 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                               ,0xec5,"(sym)","sym");
            if (!bVar9) goto LAB_00816423;
            *puVar13 = 0;
          }
          Symbol::EnsureScopeSlot(local_40,this,(FuncInfo *)sym);
        }
        if (pnodeFnc->pnodeBody != (ParseNodePtr)0x0) {
          EnsureLetConstScopeSlots(this,pnodeFnc->pnodeScopes,(FuncInfo *)sym);
LAB_0081624c:
          EnsureLetConstScopeSlots(this,pnodeFnc->pnodeBodyScope,(FuncInfo *)sym);
        }
      }
      else {
        uVar11 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)sym[6].pid);
        pIVar4 = sym[6].pid;
        lVar5._0_2_ = pIVar4->m_tk;
        lVar5._2_2_ = pIVar4->m_grfid;
        lVar5._4_4_ = pIVar4->m_luHash;
        if (lVar5 == 0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar13 = 1;
          bVar9 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                             ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
          if (!bVar9) goto LAB_00816423;
          *puVar13 = 0;
        }
        bVar9 = Js::Phases::IsEnabled
                          ((Phases *)&DAT_015bbe90,CachedScopePhase,uVar11,
                           *(LocalFunctionId *)(*(long *)&pIVar4->m_tk + 0x10));
        uVar22 = 0;
        uVar23 = 0;
        if ((((!bVar9) && (((ulong)sym[2].pid & 0x80000000000) == 0)) &&
            ((*(int *)&sym[1].next != -1 &&
             ((bVar9 = ApplyEnclosesArgs(&pnodeFnc->super_ParseNode,this), uVar22 = uVar23, !bVar9
              && (((ulong)sym[2].pid & 0x800000000000) != 0)))))) &&
           ((pnodeFnc->fncFlags & (kFunctionHasDefaultArguments|kFunctionHasDestructuredParams)) ==
            kFunctionNone)) {
          uVar11 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)sym[6].pid);
          functionId = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)sym[6].pid);
          bVar9 = Js::Phases::IsEnabled((Phases *)&DAT_015b0240,CachedScopePhase,uVar11,functionId);
          if ((bVar9) || (bVar9 = IsInDebugMode(this), !bVar9)) {
            pFVar14 = FuncInfo::GetParsedFunctionBody((FuncInfo *)sym);
            pSVar18 = Js::FunctionProxy::GetScriptContext((FunctionProxy *)pFVar14);
            if (pSVar18->threadContext->TTDLog == (EventLog *)0x0) {
              bVar9 = Js::FunctionProxy::IsCoroutine((FunctionProxy *)sym[6].pid);
              uVar22 = (uint)!bVar9 << 8;
            }
          }
        }
        *(uint *)((long)&pSVar16[2].pid + 4) =
             *(uint *)((long)&pSVar16[2].pid + 4) & 0xfffffeff | uVar22;
        if (((ulong)sym[2].pid & 0x10000000000) != 0) {
          if (*(int *)&sym[1].assignmentState != -1) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
            *puVar13 = 1;
            bVar9 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                               ,0xe19,"(funcInfo->funcObjRegister == Js::Constants::NoRegister)",
                               "funcInfo->funcObjRegister == Js::Constants::NoRegister");
            if (!bVar9) goto LAB_00816423;
            *puVar13 = 0;
          }
          pSVar16 = ParseNodeFnc::GetFuncSymbol(*(ParseNodeFnc **)&sym[6].name.len);
          if (((pSVar16 == (Symbol *)0x0) || ((pSVar16->field_0x42 & 0x20) == 0)) ||
             (RVar12 = pSVar16->location, RVar12 == 0xffffffff)) {
            RVar12 = FuncInfo::NextVarRegister((FuncInfo *)sym);
          }
          *(RegSlot *)&sym[1].assignmentState = RVar12;
          if (*(int *)&sym[1].assignmentState == -1) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
            *puVar13 = 1;
            bVar9 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                               ,0xe2a,"(funcInfo->funcObjRegister != Js::Constants::NoRegister)",
                               "funcInfo->funcObjRegister != Js::Constants::NoRegister");
            if (!bVar9) goto LAB_00816423;
            *puVar13 = 0;
          }
        }
        if (((ulong)sym[2].pid & 0x800000000) != 0) {
          for (pPVar20 = pnodeFnc->pnodeParams; pPVar20 != (ParseNode *)0x0;
              pPVar20 = ParseNode::GetFormalNext(pPVar20)) {
            if ((byte)(pPVar20->nop + ~knopList) < 3) {
              pPVar17 = ParseNode::AsParseNodeVar(pPVar20);
              Symbol::EnsureScopeSlot(pPVar17->sym,this,(FuncInfo *)sym);
            }
          }
          pPVar20 = pnodeFnc->pnodeRest;
          if ((pPVar20 != (ParseNode *)0x0) && ((byte)(pPVar20->nop + ~knopList) < 3)) {
            pPVar17 = ParseNode::AsParseNodeVar(pPVar20);
            Symbol::EnsureScopeSlot(pPVar17->sym,this,(FuncInfo *)sym);
          }
          pPVar19 = pnodeFnc->pnodeParams;
          if (pPVar19 != (ParseNodePtr)0x0) {
            do {
              if (pPVar19->nop == knopParamPattern) {
                pPVar21 = ParseNode::AsParseNodeParamPattern(pPVar19);
                handler_01.funcInfo = (FuncInfo **)&sym;
                handler_01.this = this;
                Parser::MapBindIdentifier<ByteCodeGenerator::StartEmitFunction(ParseNodeFnc*)::__1>
                          ((pPVar21->super_ParseNodeUni).pnode1,handler_01);
              }
              pPVar19 = ParseNode::GetFormalNext(pPVar19);
            } while (pPVar19 != (ParseNodePtr)0x0);
          }
          pPVar20 = pnodeFnc->pnodeRest;
          if ((pPVar20 != (ParseNode *)0x0) && (pPVar20->nop == knopParamPattern)) {
            pPVar21 = ParseNode::AsParseNodeParamPattern(pPVar20);
            handler_02.funcInfo = (FuncInfo **)&sym;
            handler_02.this = this;
            Parser::MapBindIdentifier<ByteCodeGenerator::StartEmitFunction(ParseNodeFnc*)::__1>
                      ((pPVar21->super_ParseNodeUni).pnode1,handler_02);
          }
          pSVar16 = (Symbol *)sym[8].scope;
          if (pSVar16 == (Symbol *)0x0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
            *puVar13 = 1;
            bVar9 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                               ,0xe41,"(sym)","sym");
            if (!bVar9) goto LAB_00816423;
            *puVar13 = 0;
          }
          bVar9 = Symbol::NeedsSlotAlloc(pSVar16,this,(FuncInfo *)sym);
          if (bVar9) {
            Symbol::EnsureScopeSlot(pSVar16,this,(FuncInfo *)sym);
          }
        }
        pSVar16 = ParseNodeFnc::GetFuncSymbol(*(ParseNodeFnc **)&sym[6].name.len);
        if ((pSVar16 != (Symbol *)0x0) &&
           (bVar9 = Symbol::NeedsSlotAlloc(pSVar16,this,(FuncInfo *)sym), bVar9)) {
          pcVar6 = sym[6].name.string.ptr;
          if ((pcVar6 == (char16_t *)0x0) || ((pcVar6[0x22] & L'\x02') == L'\0')) {
            if (((ulong)sym[2].pid & 0x20000000000) != 0) {
              Symbol::EnsureScopeSlot(pSVar16,this,(FuncInfo *)sym);
            }
          }
          else {
            pSVar16->scopeSlot = 0;
          }
        }
        if (((ulong)sym[2].pid & 0x800000000) == 0) {
          pPVar19 = pnodeFnc->pnodeParams;
          if (pPVar19 == (ParseNodePtr)0x0) {
            uVar22 = 1;
          }
          else {
            uVar10 = 1;
            do {
              if (((byte)(pPVar19->nop + ~knopList) < 3) &&
                 (pPVar17 = ParseNode::AsParseNodeVar(pPVar19),
                 pPVar17->sym->location + 1 == (uint)uVar10)) {
                pPVar17 = ParseNode::AsParseNodeVar(pPVar19);
                Symbol::EnsureScopeSlot(pPVar17->sym,this,(FuncInfo *)sym);
              }
              uVar10 = uVar10 + 1;
              pPVar19 = ParseNode::GetFormalNext(pPVar19);
            } while (pPVar19 != (ParseNodePtr)0x0);
            uVar22 = (uint)uVar10;
          }
          pPVar20 = pnodeFnc->pnodeRest;
          if (((pPVar20 != (ParseNode *)0x0) && ((byte)(pPVar20->nop + ~knopList) < 3)) &&
             (pPVar17 = ParseNode::AsParseNodeVar(pPVar20), pPVar17->sym->location + 1 == uVar22)) {
            pPVar17 = ParseNode::AsParseNodeVar(pPVar20);
            Symbol::EnsureScopeSlot(pPVar17->sym,this,(FuncInfo *)sym);
          }
          pPVar19 = pnodeFnc->pnodeParams;
          if (pPVar19 != (ParseNodePtr)0x0) {
            do {
              if (pPVar19->nop == knopParamPattern) {
                pPVar21 = ParseNode::AsParseNodeParamPattern(pPVar19);
                handler_03.funcInfo = (FuncInfo **)&sym;
                handler_03.this = this;
                Parser::MapBindIdentifier<ByteCodeGenerator::StartEmitFunction(ParseNodeFnc*)::__3>
                          ((pPVar21->super_ParseNodeUni).pnode1,handler_03);
              }
              pPVar19 = ParseNode::GetFormalNext(pPVar19);
            } while (pPVar19 != (ParseNodePtr)0x0);
          }
          pPVar20 = pnodeFnc->pnodeRest;
          if ((pPVar20 != (ParseNode *)0x0) && (pPVar20->nop == knopParamPattern)) {
            pPVar21 = ParseNode::AsParseNodeParamPattern(pPVar20);
            handler_04.funcInfo = (FuncInfo **)&sym;
            handler_04.this = this;
            Parser::MapBindIdentifier<ByteCodeGenerator::StartEmitFunction(ParseNodeFnc*)::__3>
                      ((pPVar21->super_ParseNodeUni).pnode1,handler_04);
          }
        }
        local_40 = (Symbol *)pnodeFnc->pnodeVars;
        while (local_40 != (Symbol *)0x0) {
          pPVar17 = ParseNode::AsParseNodeVar((ParseNode *)local_40);
          pSVar16 = pPVar17->sym;
          pPVar17 = ParseNode::AsParseNodeVar((ParseNode *)local_40);
          if ((pPVar17->isBlockScopeFncDeclVar == '\0') || ((pSVar16->field_0x42 & 2) == 0)) {
            if (((*(ushort *)&pSVar16->field_0x42 & 0x40) != 0) ||
               ((pSVar24 = pSVar16, (*(ushort *)&pSVar16->field_0x42 & 2) != 0 &&
                (*(char *)&(local_40->name).string.ptr == 'Q')))) {
              pSVar24 = *(Symbol **)(*(long *)&sym[5].assignmentState + 0x20);
              while ((pSVar24 != (Symbol *)0x0 &&
                     (bVar9 = JsUtil::CharacterBuffer<char16_t>::operator==
                                        (&pSVar24->name,&pSVar16->name), !bVar9))) {
                pSVar24 = pSVar24->next;
              }
            }
            if ((pSVar24->symbolType == STVariable) &&
               (bVar9 = Symbol::IsArguments(pSVar24), !bVar9)) {
              Symbol::EnsureScopeSlot(pSVar24,this,(FuncInfo *)sym);
            }
          }
          pPVar17 = ParseNode::AsParseNodeVar((ParseNode *)local_40);
          local_40 = (Symbol *)pPVar17->pnodeNext;
        }
        local_68.pnode = (ParseNode **)&local_40;
        local_68.funcInfo = (FuncInfo **)&sym;
        local_68.this = this;
        StartEmitFunction::anon_class_24_3_8900e8ef::operator()
                  (&local_68,pnodeFnc->pnodeScopes->pnodeScopes);
        if (pnodeFnc->pnodeBodyScope != (ParseNodeBlock *)0x0) {
          StartEmitFunction::anon_class_24_3_8900e8ef::operator()
                    (&local_68,pnodeFnc->pnodeBodyScope->pnodeScopes);
        }
        innerScope = local_48;
        if (pnodeFnc->pnodeBody != (ParseNodePtr)0x0) {
          if ((pnodeFnc->pnodeScopes->super_ParseNodeStmt).super_ParseNode.nop != knopBlock) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
            *puVar13 = 1;
            bVar9 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                               ,0xe98,"(pnodeFnc->pnodeScopes->nop == knopBlock)",
                               "pnodeFnc->pnodeScopes->nop == knopBlock");
            if (!bVar9) goto LAB_00816423;
            *puVar13 = 0;
          }
          goto LAB_0081624c;
        }
      }
      if (*(int *)&sym[1].next == -1) {
        if ((((pnodeFnc->isBodyAndParamScopeMerged != false) || (innerScope->scopeSlotCount != 0))
            && (*(ushort *)&innerScope->field_0x44 =
                     (ushort)*(undefined4 *)&innerScope->field_0x44 & 0xffef |
                     (ushort)(*(int *)((long)&sym[1].next + 4) != -1) << 4, local_50 != (Scope *)0x0
               )) && ((pnodeFnc->isBodyAndParamScopeMerged != false &&
                      ((*(uint *)&local_50->field_0x44 >> 10 & 1) != 0)))) {
          *(ushort *)&local_50->field_0x44 =
               (ushort)*(uint *)&local_50->field_0x44 & 0xffef |
               (ushort)(*(int *)((long)&sym[1].next + 4) != -1) << 4;
        }
      }
      else {
        innerScope->field_0x44 = innerScope->field_0x44 | 0x10;
      }
      if (pnodeFnc->isBodyAndParamScopeMerged == false) {
        uVar10 = *(ushort *)&local_50->field_0x44;
        if (*(int *)&sym[1].next == -1) {
          uVar10 = uVar10 & 0xffef | uVar10 >> 4 & 0x10;
        }
        else {
          uVar10 = uVar10 | 0x10;
        }
        *(ushort *)&local_50->field_0x44 = uVar10;
      }
    }
  }
  PushFuncInfo(this,L"StartEmitFunction",(FuncInfo *)sym);
  if (((ulong)sym[2].pid & 0x800000000000) == 0) {
    pPVar7 = pnodeFnc->pnodeScopes;
    if ((~pPVar7->field_0x5c & 3) != 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar13 = 1;
      bVar9 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                         ,0xf00,"(paramBlock->blockType == Parameter)",
                         "paramBlock->blockType == Parameter");
      if (!bVar9) goto LAB_00816423;
      *puVar13 = 0;
    }
    pSVar3 = local_50;
    PushScope(this,local_50);
    EmitScopeList(this,pPVar7->pnodeScopes,(ParseNode *)pnodeFnc->pnodeBodyScope);
    if (this->currentScope != pSVar3) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar13 = 1;
      bVar9 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                         ,0xf07,"(this->GetCurrentScope() == paramScope)",
                         "this->GetCurrentScope() == paramScope");
      if (!bVar9) {
LAB_00816423:
        pcVar8 = (code *)invalidInstructionException();
        (*pcVar8)();
      }
      *puVar13 = 0;
    }
  }
  PushScope(this,innerScope);
  return;
}

Assistant:

void ByteCodeGenerator::StartEmitFunction(ParseNodeFnc *pnodeFnc)
{
    Assert(pnodeFnc->nop == knopFncDecl || pnodeFnc->nop == knopProg);

    FuncInfo *funcInfo = pnodeFnc->funcInfo;
    Scope * const bodyScope = funcInfo->GetBodyScope();
    Scope * const paramScope = funcInfo->GetParamScope();

    if (funcInfo->byteCodeFunction->IsFunctionParsed() && funcInfo->root->pnodeBody != nullptr)
    {
        if (funcInfo->GetParsedFunctionBody()->GetByteCode() == nullptr && !(flags & (fscrEval | fscrImplicitThis)))
        {
            // Only set the environment depth if it's truly known (i.e., not in eval or event handler).
            funcInfo->GetParsedFunctionBody()->SetEnvDepth(this->envDepth);
        }

        if (funcInfo->GetCallsEval())
        {
            funcInfo->byteCodeFunction->SetDontInline(true);
        }

        Scope * const funcExprScope = funcInfo->funcExprScope;
        if (funcExprScope)
        {
            if (funcInfo->GetCallsEval())
            {
                Assert(funcExprScope->GetIsObject());
            }

            if (funcExprScope->GetIsObject())
            {
                funcExprScope->SetCapturesAll(true);
                funcExprScope->SetMustInstantiate(true);
                PushScope(funcExprScope);
            }
            else
            {
                Symbol *sym = funcInfo->root->GetFuncSymbol();
                if (funcInfo->IsBodyAndParamScopeMerged())
                {
                    funcInfo->bodyScope->AddSymbol(sym);
                }
                else
                {
                    funcInfo->paramScope->AddSymbol(sym);
                }
                sym->EnsureScopeSlot(this, funcInfo);
                if (sym->GetHasNonLocalReference())
                {
                    sym->GetScope()->SetHasOwnLocalInClosure(true);
                }
            }
        }

        if (pnodeFnc->nop != knopProg)
        {
            if (!bodyScope->GetIsObject() && NeedObjectAsFunctionScope(funcInfo, pnodeFnc))
            {
                Assert(bodyScope->GetIsObject());
            }

            if (bodyScope->GetIsObject())
            {
                bodyScope->SetLocation(funcInfo->frameObjRegister);
            }
            else
            {
                bodyScope->SetLocation(funcInfo->frameSlotsRegister);
            }

            if (!funcInfo->IsBodyAndParamScopeMerged())
            {
                if (paramScope->GetIsObject())
                {
                    paramScope->SetLocation(funcInfo->frameObjRegister);
                }
                else
                {
                    paramScope->SetLocation(funcInfo->frameSlotsRegister);
                }
            }

            if (bodyScope->GetIsObject())
            {
                // Win8 908700: Disable under F12 debugger because there are too many cached scopes holding onto locals.
                funcInfo->SetHasCachedScope(
                    !PHASE_OFF(Js::CachedScopePhase, funcInfo->byteCodeFunction) &&
                    !funcInfo->Escapes() &&
                    funcInfo->frameObjRegister != Js::Constants::NoRegister &&
                    !ApplyEnclosesArgs(pnodeFnc, this) &&
                    funcInfo->IsBodyAndParamScopeMerged() && // There is eval in the param scope
                    !pnodeFnc->HasDefaultArguments() &&
                    !pnodeFnc->HasDestructuredParams() &&
                    (PHASE_FORCE(Js::CachedScopePhase, funcInfo->byteCodeFunction) || !IsInDebugMode())
#if ENABLE_TTD
                    && !funcInfo->GetParsedFunctionBody()->GetScriptContext()->GetThreadContext()->IsRuntimeInTTDMode()
#endif
                    && !funcInfo->byteCodeFunction->IsCoroutine()
                );

                if (funcInfo->GetHasCachedScope())
                {
                    Assert(funcInfo->funcObjRegister == Js::Constants::NoRegister);
                    Symbol *funcSym = funcInfo->root->GetFuncSymbol();
                    if (funcSym && funcSym->GetIsFuncExpr())
                    {
                        if (funcSym->GetLocation() == Js::Constants::NoRegister)
                        {
                            funcInfo->funcObjRegister = funcInfo->NextVarRegister();
                        }
                        else
                        {
                            funcInfo->funcObjRegister = funcSym->GetLocation();
                        }
                    }
                    else
                    {
                        funcInfo->funcObjRegister = funcInfo->NextVarRegister();
                    }
                    Assert(funcInfo->funcObjRegister != Js::Constants::NoRegister);
                }

                ParseNode *pnode;
                Symbol *sym;

                if (funcInfo->GetHasArguments())
                {
                    // Process function's formal parameters
                    MapFormals(pnodeFnc, [&](ParseNode *pnode)
                    {
                        if (pnode->IsVarLetOrConst())
                        {
                            pnode->AsParseNodeVar()->sym->EnsureScopeSlot(this, funcInfo);
                        }
                    });

                    MapFormalsFromPattern(pnodeFnc, [&](ParseNode *pnode) { pnode->AsParseNodeVar()->sym->EnsureScopeSlot(this, funcInfo); });

                    // Only allocate scope slot for "arguments" when really necessary. "hasDeferredChild"
                    // doesn't require scope slot for "arguments" because inner functions can't access
                    // outer function's arguments directly.
                    sym = funcInfo->GetArgumentsSymbol();
                    Assert(sym);
                    if (sym->NeedsSlotAlloc(this, funcInfo))
                    {
                        sym->EnsureScopeSlot(this, funcInfo);
                    }
                }

                sym = funcInfo->root->GetFuncSymbol();

                if (sym && sym->NeedsSlotAlloc(this, funcInfo))
                {
                    if (funcInfo->funcExprScope && funcInfo->funcExprScope->GetIsObject())
                    {
                        sym->SetScopeSlot(0);
                    }
                    else if (funcInfo->GetFuncExprNameReference())
                    {
                        sym->EnsureScopeSlot(this, funcInfo);
                    }
                }

                if (!funcInfo->GetHasArguments())
                {
                    Symbol *formal;
                    Js::ArgSlot pos = 1;
                    auto moveArgToReg = [&](ParseNode *pnode)
                    {
                        if (pnode->IsVarLetOrConst())
                        {
                            formal = pnode->AsParseNodeVar()->sym;
                            // Get the param from its argument position into its assigned register.
                            // The position should match the location; otherwise, it has been shadowed by parameter with the same name.
                            if (formal->GetLocation() + 1 == pos)
                            {
                                pnode->AsParseNodeVar()->sym->EnsureScopeSlot(this, funcInfo);
                            }
                        }
                        pos++;
                    };
                    MapFormals(pnodeFnc, moveArgToReg);
                    MapFormalsFromPattern(pnodeFnc, [&](ParseNode *pnode) { pnode->AsParseNodeVar()->sym->EnsureScopeSlot(this, funcInfo); });
                }

                for (pnode = pnodeFnc->pnodeVars; pnode; pnode = pnode->AsParseNodeVar()->pnodeNext)
                {
                    sym = pnode->AsParseNodeVar()->sym;
                    if (!(pnode->AsParseNodeVar()->isBlockScopeFncDeclVar && sym->GetIsBlockVar()))
                    {
                        if (sym->GetIsCatch() || (pnode->nop == knopVarDecl && sym->GetIsBlockVar()))
                        {
                            sym = funcInfo->bodyScope->FindLocalSymbol(sym->GetName());
                        }
                        if (sym->GetSymbolType() == STVariable && !sym->IsArguments())
                        {
                            sym->EnsureScopeSlot(this, funcInfo);
                        }
                    }
                }
                auto ensureFncDeclScopeSlots = [&](ParseNode *pnodeScope)
                {
                    for (pnode = pnodeScope; pnode;)
                    {
                        switch (pnode->nop)
                        {
                        case knopFncDecl:
                            if (pnode->AsParseNodeFnc()->IsDeclaration())
                            {
                                EnsureFncDeclScopeSlot(pnode->AsParseNodeFnc(), funcInfo);
                            }
                            pnode = pnode->AsParseNodeFnc()->pnodeNext;
                            break;
                        case knopBlock:
                            pnode = pnode->AsParseNodeBlock()->pnodeNext;
                            break;
                        case knopCatch:
                            pnode = pnode->AsParseNodeCatch()->pnodeNext;
                            break;
                        case knopWith:
                            pnode = pnode->AsParseNodeWith()->pnodeNext;
                            break;
                        }
                    }
                };
                pnodeFnc->MapContainerScopes(ensureFncDeclScopeSlots);

                if (pnodeFnc->pnodeBody)
                {
                    Assert(pnodeFnc->pnodeScopes->nop == knopBlock);
                    this->EnsureLetConstScopeSlots(pnodeFnc->pnodeBodyScope, funcInfo);
                }
            }
            else
            {
                ParseNode *pnode;
                Symbol *sym;

                pnodeFnc->MapContainerScopes([&](ParseNode *pnodeScope) { this->EnsureFncScopeSlots(pnodeScope, funcInfo); });

                for (pnode = pnodeFnc->pnodeVars; pnode; pnode = pnode->AsParseNodeVar()->pnodeNext)
                {
                    sym = pnode->AsParseNodeVar()->sym;
                    if (!(pnode->AsParseNodeVar()->isBlockScopeFncDeclVar && sym->GetIsBlockVar()))
                    {
                        if (sym->GetIsCatch() || (pnode->nop == knopVarDecl && sym->GetIsBlockVar()))
                        {
                            sym = funcInfo->bodyScope->FindLocalSymbol(sym->GetName());
                        }
                        if (sym->GetSymbolType() == STVariable && sym->NeedsSlotAlloc(this, funcInfo) && !sym->IsArguments())
                        {
                            sym->EnsureScopeSlot(this, funcInfo);
                        }
                    }
                }

                auto ensureScopeSlot = [&](ParseNode *pnode)
                {
                    if (pnode->IsVarLetOrConst())
                    {
                        sym = pnode->AsParseNodeVar()->sym;
                        if (sym->GetSymbolType() == STFormal && sym->NeedsSlotAlloc(this, funcInfo))
                        {
                            sym->EnsureScopeSlot(this, funcInfo);
                        }
                    }
                };
                // Process function's formal parameters
                MapFormals(pnodeFnc, ensureScopeSlot);
                MapFormalsFromPattern(pnodeFnc, ensureScopeSlot);

                if (funcInfo->GetHasArguments())
                {
                    sym = funcInfo->GetArgumentsSymbol();
                    Assert(sym);

                    // There is no eval so the arguments may be captured in a lambda.
                    // But we cannot relay on slots getting allocated while the lambda is emitted as the function body may be reparsed.
                    sym->EnsureScopeSlot(this, funcInfo);
                }

                if (pnodeFnc->pnodeBody)
                {
                    this->EnsureLetConstScopeSlots(pnodeFnc->pnodeScopes, funcInfo);
                    this->EnsureLetConstScopeSlots(pnodeFnc->pnodeBodyScope, funcInfo);
                }
            }

            // When we have split scope and body scope does not have any scope slots allocated, we don't have to mark the body scope as mustinstantiate.
            if (funcInfo->frameObjRegister != Js::Constants::NoRegister)
            {
                bodyScope->SetMustInstantiate(true);
            }
            else if (pnodeFnc->IsBodyAndParamScopeMerged() || bodyScope->GetScopeSlotCount() != 0)
            {
                bodyScope->SetMustInstantiate(funcInfo->frameSlotsRegister != Js::Constants::NoRegister);

                if (pnodeFnc->IsBodyAndParamScopeMerged() && paramScope && paramScope->GetHasNestedParamFunc())
                {
                    paramScope->SetMustInstantiate(funcInfo->frameSlotsRegister != Js::Constants::NoRegister);
                }
            }

            if (!pnodeFnc->IsBodyAndParamScopeMerged())
            {
                if (funcInfo->frameObjRegister != Js::Constants::NoRegister)
                {
                    paramScope->SetMustInstantiate(true);
                }
                else
                {
                    // In the case of function expression being captured in the param scope the hasownlocalinclosure will be false for param scope,
                    // as function expression symbol stays in the function expression scope. We don't have to set mustinstantiate for param scope in that case.
                    paramScope->SetMustInstantiate(paramScope->GetHasOwnLocalInClosure());
                }
            }
        }
        else
        {
            bool newScopeForEval = (funcInfo->byteCodeFunction->GetIsStrictMode() && (this->GetFlags() & fscrEval));

            if (newScopeForEval)
            {
                Assert(bodyScope->GetIsObject());
            }
        }
    }

    PushFuncInfo(_u("StartEmitFunction"), funcInfo);

    if (!funcInfo->IsBodyAndParamScopeMerged())
    {
        ParseNodeBlock * paramBlock = pnodeFnc->pnodeScopes;
        Assert(paramBlock->blockType == Parameter);

        PushScope(paramScope);

        // While emitting the functions we have to stop when we see the body scope block.
        // Otherwise functions defined in the body scope will not be able to get the right references.
        this->EmitScopeList(paramBlock->pnodeScopes, pnodeFnc->pnodeBodyScope);
        Assert(this->GetCurrentScope() == paramScope);
    }

    PushScope(bodyScope);
}